

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void get_extension(char *file_name,char *extension)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *local_38;
  char *p;
  size_t i;
  size_t ext_len;
  size_t length;
  char *extension_local;
  char *file_name_local;
  
  sVar3 = strlen(file_name);
  i = 0;
  pcVar1 = file_name + sVar3;
  while( true ) {
    local_38 = pcVar1 + -1;
    if (local_38 < file_name) {
      *extension = '\0';
      return;
    }
    if (*local_38 == '.') break;
    i = i + 1;
    pcVar1 = local_38;
  }
  for (p = (char *)0x0; p < i; p = p + 1) {
    iVar2 = tolower((int)pcVar1[(long)p]);
    extension[(long)p] = (char)iVar2;
  }
  extension[(long)p] = '\0';
  return;
}

Assistant:

static void get_extension(const char *file_name, char *extension)
{
    size_t length = strlen(file_name);
    size_t ext_len = 0;
    size_t i = 0;
    const char *p = file_name + length - 1;

    while (p >= file_name) {
        if (p[0] == '.') {
            for (i = 0; i < ext_len; i++)
                extension[i] = tolower(p[i + 1]);

            extension[i] = '\0';
            return ;
        }
        ext_len++;
        p--;
    }

    extension[0] = '\0';
}